

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O3

int __thiscall ncnn::LSTM_x86::create_pipeline(LSTM_x86 *this,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  _func_int **pp_Var4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int *piVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined4 *puVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  uint _c;
  undefined4 *puVar34;
  _func_int *p_Var35;
  ulong uVar36;
  
  p_Var35 = this->_vptr_LSTM_x86[-3];
  _c = (*(int *)(p_Var35 + 0x40 + (long)&(this->weight_hc_data_packed).data) == 2) + 1;
  iVar19 = (int)((long)((ulong)(uint)((int)((long)*(int *)(p_Var35 + 0x3c +
                                                          (long)&(this->weight_hc_data_packed).data)
                                           / (long)(int)_c) >> 0x1f) << 0x20 |
                       (long)*(int *)(p_Var35 + 0x3c + (long)&(this->weight_hc_data_packed).data) /
                       (long)(int)_c & 0xffffffffU) /
                (long)*(int *)(p_Var35 + 0x44 + (long)&(this->weight_hc_data_packed).data));
  iVar33 = iVar19 + 3;
  if (-1 < iVar19) {
    iVar33 = iVar19;
  }
  uVar36 = 0;
  Mat::create(&this->weight_xc_data_packed,iVar33 >> 2,
              *(int *)(p_Var35 + 0x44 + (long)&(this->weight_hc_data_packed).data),_c,0x10,4,
              (Allocator *)0x0);
  Mat::create(&this->bias_c_data_packed,
              *(int *)(this->_vptr_LSTM_x86[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data),
              1,_c,0x10,4,(Allocator *)0x0);
  Mat::create(&this->weight_hc_data_packed,
              *(int *)(this->_vptr_LSTM_x86[-3] + 0x38 + (long)&(this->weight_hc_data_packed).data),
              *(int *)(this->_vptr_LSTM_x86[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data),
              _c,0x10,4,(Allocator *)0x0);
  pp_Var4 = this->_vptr_LSTM_x86;
  pvVar5 = (this->weight_xc_data_packed).data;
  iVar1 = (this->weight_xc_data_packed).w;
  sVar6 = (this->weight_xc_data_packed).elemsize;
  sVar7 = (this->weight_xc_data_packed).cstep;
  pvVar8 = (this->bias_c_data_packed).data;
  sVar9 = (this->bias_c_data_packed).cstep;
  sVar10 = (this->bias_c_data_packed).elemsize;
  iVar2 = (this->weight_hc_data_packed).w;
  pvVar11 = (this->weight_hc_data_packed).data;
  sVar12 = (this->weight_hc_data_packed).elemsize;
  sVar13 = (this->weight_hc_data_packed).cstep;
  p_Var35 = pp_Var4[-3];
  do {
    if (0 < *(int *)(p_Var35 + 0x44 + (long)&(this->weight_hc_data_packed).data)) {
      lVar14 = *(long *)(&this->field_0x138 + (long)p_Var35);
      lVar28 = *(long *)(&this->field_0x1b0 + (long)p_Var35) * uVar36 *
               *(long *)(&this->field_0x180 + (long)p_Var35) +
               *(long *)(&this->field_0x170 + (long)p_Var35);
      lVar15 = *(long *)(&this->field_0xf0 + (long)p_Var35);
      lVar21 = (long)*(int *)(&this->field_0x19c + (long)p_Var35) *
               *(long *)(&this->field_0x180 + (long)p_Var35);
      puVar25 = (undefined4 *)(sVar9 * sVar10 * uVar36 + (long)pvVar8);
      lVar22 = (long)*(int *)(&this->field_0x10c + (long)p_Var35);
      lVar24 = (long)*(int *)(&this->field_0x154 + (long)p_Var35);
      lVar30 = *(long *)(&this->field_0x168 + (long)p_Var35) * uVar36;
      lVar16 = *(long *)(&this->field_0x128 + (long)p_Var35);
      lVar31 = lVar30 * lVar14 + lVar16;
      lVar17 = *(long *)(&this->field_0xe0 + (long)p_Var35);
      lVar26 = *(long *)(&this->field_0x120 + (long)p_Var35) * uVar36;
      lVar27 = lVar26 * lVar15 + lVar17;
      lVar23 = 0;
      do {
        *puVar25 = *(undefined4 *)(lVar28 + lVar23 * 4);
        puVar25[1] = *(undefined4 *)(lVar28 + lVar21 + lVar23 * 4);
        puVar25[2] = *(undefined4 *)(lVar28 + lVar21 * 2 + lVar23 * 4);
        puVar25[3] = *(undefined4 *)(lVar21 * 3 + lVar28 + lVar23 * 4);
        p_Var35 = pp_Var4[-3];
        iVar3 = *(int *)(p_Var35 + 0x44 + (long)&(this->weight_hc_data_packed).data);
        iVar20 = (int)lVar23;
        if (3 < iVar19) {
          puVar34 = (undefined4 *)
                    ((long)pvVar5 + (long)iVar1 * sVar6 * lVar23 + sVar7 * sVar6 * uVar36);
          uVar32 = 0;
          do {
            *puVar34 = *(undefined4 *)(lVar31 + uVar32 * 4);
            puVar34[1] = *(undefined4 *)
                          (((iVar3 + iVar20) * lVar24 + lVar30) * lVar14 + lVar16 + uVar32 * 4);
            puVar34[2] = *(undefined4 *)
                          (((iVar3 * 2 + iVar20) * lVar24 + lVar30) * lVar14 + lVar16 + uVar32 * 4);
            puVar34[3] = *(undefined4 *)
                          (((iVar20 + iVar3 * 3) * lVar24 + lVar30) * lVar14 + lVar16 + uVar32 * 4);
            puVar34 = puVar34 + 4;
            uVar32 = uVar32 + 1;
          } while ((uint)(iVar33 >> 2) != uVar32);
          p_Var35 = pp_Var4[-3];
        }
        if (0 < *(int *)(p_Var35 + 0x38 + (long)&(this->weight_hc_data_packed).data)) {
          puVar34 = (undefined4 *)
                    ((long)pvVar11 + (long)iVar2 * sVar12 * lVar23 + sVar13 * sVar12 * uVar36);
          lVar29 = 0;
          do {
            *puVar34 = *(undefined4 *)(lVar27 + lVar29 * 4);
            puVar34[1] = *(undefined4 *)
                          (((iVar3 + iVar20) * lVar22 + lVar26) * lVar15 + lVar17 + lVar29 * 4);
            puVar34[2] = *(undefined4 *)
                          (((iVar3 * 2 + iVar20) * lVar22 + lVar26) * lVar15 + lVar17 + lVar29 * 4);
            puVar34[3] = *(undefined4 *)
                          (((iVar3 * 3 + iVar20) * lVar22 + lVar26) * lVar15 + lVar17 + lVar29 * 4);
            lVar29 = lVar29 + 1;
            p_Var35 = pp_Var4[-3];
            puVar34 = puVar34 + 4;
          } while (lVar29 < *(int *)(p_Var35 + 0x38 + (long)&(this->weight_hc_data_packed).data));
        }
        puVar25 = puVar25 + 4;
        lVar23 = lVar23 + 1;
        lVar31 = lVar31 + lVar14 * lVar24;
        lVar27 = lVar27 + lVar15 * lVar22;
      } while (lVar23 < *(int *)(p_Var35 + 0x44 + (long)&(this->weight_hc_data_packed).data));
    }
    uVar36 = uVar36 + 1;
  } while (uVar36 != _c);
  if (opt->lightmode != false) {
    piVar18 = *(int **)(&this->field_0x130 + (long)p_Var35);
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + -1;
      UNLOCK();
      if (*piVar18 == 0) {
        if (*(long **)(&this->field_0x148 + (long)p_Var35) == (long *)0x0) {
          if (*(void **)(&this->field_0x128 + (long)p_Var35) != (void *)0x0) {
            free(*(void **)(&this->field_0x128 + (long)p_Var35));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x148 + (long)p_Var35) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x168 + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0x134 + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0x128 + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0x150 + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var35) = 0;
    *(undefined4 *)(&this->field_0x160 + (long)p_Var35) = 0;
    p_Var35 = this->_vptr_LSTM_x86[-3];
    piVar18 = *(int **)(&this->field_0x178 + (long)p_Var35);
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + -1;
      UNLOCK();
      if (*piVar18 == 0) {
        if (*(long **)(&this->field_0x190 + (long)p_Var35) == (long *)0x0) {
          if (*(void **)(&this->field_0x170 + (long)p_Var35) != (void *)0x0) {
            free(*(void **)(&this->field_0x170 + (long)p_Var35));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x190 + (long)p_Var35) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1b0 + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0x17c + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0x184 + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0x170 + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0x198 + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var35) = 0;
    *(undefined4 *)(&this->field_0x1a8 + (long)p_Var35) = 0;
    p_Var35 = this->_vptr_LSTM_x86[-3];
    piVar18 = *(int **)(&this->field_0xe8 + (long)p_Var35);
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + -1;
      UNLOCK();
      if (*piVar18 == 0) {
        if (*(long **)(&this->field_0x100 + (long)p_Var35) == (long *)0x0) {
          if (*(void **)(&this->field_0xe0 + (long)p_Var35) != (void *)0x0) {
            free(*(void **)(&this->field_0xe0 + (long)p_Var35));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x100 + (long)p_Var35) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x120 + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0xec + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0xf4 + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0xe0 + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0xe8 + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0x108 + (long)p_Var35) = 0;
    *(undefined8 *)(&this->field_0x110 + (long)p_Var35) = 0;
    *(undefined4 *)(&this->field_0x118 + (long)p_Var35) = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86::create_pipeline(const Option& opt)
{
    // pack IFOG
    int num_directions = direction == 2 ? 2 : 1;
    int size = weight_data_size / num_directions / hidden_size / 4;

#if __AVX__
    weight_xc_data_packed.create(size, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
#else
    weight_xc_data_packed.create(size, hidden_size, num_directions, 16u, 4);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size, num_directions, 16u, 4);
#endif

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int dr = 0; dr < num_directions; dr++)
    {
        const Mat weight_xc = weight_xc_data.channel(dr);
        const Mat bias_c = bias_c_data.channel(dr);
        const Mat weight_hc = weight_hc_data.channel(dr);

        Mat weight_xc_data_packed_dr = weight_xc_data_packed.channel(dr);
        Mat bias_c_data_packed_dr = bias_c_data_packed.channel(dr);
        Mat weight_hc_data_packed_dr = weight_hc_data_packed.channel(dr);

        const float* bias_c_I = bias_c.row(0);
        const float* bias_c_F = bias_c.row(1);
        const float* bias_c_O = bias_c.row(2);
        const float* bias_c_G = bias_c.row(3);

        float* bias_c_IFOG = bias_c_data_packed_dr.row(0);

        int q = 0;
#if __AVX__
        for (; q + 1 < hidden_size; q += 2)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];
            bias_c_IFOG[4] = bias_c_I[q + 1];
            bias_c_IFOG[5] = bias_c_F[q + 1];
            bias_c_IFOG[6] = bias_c_O[q + 1];
            bias_c_IFOG[7] = bias_c_G[q + 1];

            bias_c_IFOG += 8;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(hidden_size * 0 + q + 1);
            const float* weight_xc_F_1 = weight_xc.row(hidden_size * 1 + q + 1);
            const float* weight_xc_O_1 = weight_xc.row(hidden_size * 2 + q + 1);
            const float* weight_xc_G_1 = weight_xc.row(hidden_size * 3 + q + 1);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(hidden_size * 0 + q + 1);
            const float* weight_hc_F_1 = weight_hc.row(hidden_size * 1 + q + 1);
            const float* weight_hc_O_1 = weight_hc.row(hidden_size * 2 + q + 1);
            const float* weight_hc_G_1 = weight_hc.row(hidden_size * 3 + q + 1);

            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2);

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];
                weight_xc_IFOG[4] = weight_xc_I_1[i];
                weight_xc_IFOG[5] = weight_xc_F_1[i];
                weight_xc_IFOG[6] = weight_xc_O_1[i];
                weight_xc_IFOG[7] = weight_xc_G_1[i];

                weight_xc_IFOG += 8;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];
                weight_hc_IFOG[4] = weight_hc_I_1[i];
                weight_hc_IFOG[5] = weight_hc_F_1[i];
                weight_hc_IFOG[6] = weight_hc_O_1[i];
                weight_hc_IFOG[7] = weight_hc_G_1[i];

                weight_hc_IFOG += 8;
            }
        }
#endif // __AVX__
        for (; q < hidden_size; q++)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];

            bias_c_IFOG += 4;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

#if __AVX__
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2 + q % 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2 + q % 2);
#else
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q);
#endif

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];

                weight_xc_IFOG += 4;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];

                weight_hc_IFOG += 4;
            }
        }
    }

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
    }

    return 0;
}